

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall
QRasterPaintEngine::drawTiledPixmap(QRasterPaintEngine *this,QRectF *r,QPixmap *pixmap,QPointF *sr)

{
  QTransform *this_00;
  QPaintEngineState *pQVar1;
  QRasterPaintEnginePrivate *this_01;
  QSpanData *this_02;
  int iVar2;
  TransformationType TVar3;
  QPlatformPixmap *pQVar4;
  QClipData *pQVar5;
  long lVar6;
  QRasterBuffer *this_03;
  QTransform *pQVar7;
  QTransform *pQVar8;
  QPaintEngineState *pQVar9;
  long in_FS_OFFSET;
  byte bVar10;
  ulong uVar11;
  qreal qVar12;
  double dVar13;
  QColor QVar14;
  QPointF local_f8;
  QPointF local_e8;
  QRect local_d8;
  undefined1 local_c8 [16];
  QImageData *local_b8;
  QPainterPath path;
  double local_98;
  double dStack_90;
  QTransform local_88;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  this_01 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar9 = pQVar1 + -2;
  if (pQVar1 == (QPaintEngineState *)0x0) {
    pQVar9 = (QPaintEngineState *)0x0;
  }
  local_b8 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_c8);
  pQVar4 = QPixmap::handle(pixmap);
  if (pQVar4->id == 0) {
    this_03 = (QRasterBuffer *)(pQVar4 + 1);
    QImage::operator=((QImage *)local_c8,(QImage *)this_03);
  }
  else {
    QPixmap::toImage((QImage *)&local_88,pixmap);
    this_03 = (QRasterBuffer *)&local_88;
    QImage::operator=((QImage *)local_c8,(QImage *)&local_88);
    QImage::~QImage((QImage *)&local_88);
  }
  iVar2 = QImage::depth((QImage *)local_c8);
  if (iVar2 == 1) {
    QVar14 = QPen::color((QPen *)(pQVar9 + 0x10));
    path.d_ptr.d.ptr = QVar14._0_8_;
    QRasterBuffer::colorizeBitmap((QImage *)&local_88,this_03,(QImage *)local_c8,(QColor *)&path);
    QImage::operator=((QImage *)local_c8,(QImage *)&local_88);
    QImage::~QImage((QImage *)&local_88);
  }
  qVar12 = QPixmap::devicePixelRatio(pixmap);
  this_00 = (QTransform *)(pQVar9 + 0x36);
  TVar3 = QTransform::type(this_00);
  if ((1.0 < qVar12) || (1 < (int)TVar3)) {
    pQVar7 = this_00;
    pQVar8 = &local_88;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pQVar8->m_matrix[0][0] = pQVar7->m_matrix[0][0];
      pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar10 * -2 + 1) * 8);
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    QTransform::translate(&local_88,r->xp,r->yp);
    QTransform::translate(&local_88,-sr->xp,-sr->yp);
    QTransform::scale(&local_88,1.0 / qVar12,1.0 / qVar12);
    pQVar5 = QRasterPaintEnginePrivate::clip(this_01);
    this_02 = &this_01->image_filler_xform;
    (this_01->image_filler_xform).clip = pQVar5;
    path.d_ptr.d.ptr =
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (totally_ordered_wrapper<QPainterPathPrivate_*>)0x0;
    QSpanData::initTexture
              (this_02,(QImage *)local_c8,
               pQVar9[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
               super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,Tiled,(QRect *)&path);
    if ((this_01->image_filler_xform).blend != (ProcessSpans)0x0) {
      QSpanData::setupMatrix
                (this_02,&local_88,
                 pQVar9[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                 super_QFlagsStorage<QPaintEngine::DirtyFlag>.i >> 4 & 1);
      ensureRasterState(this);
      if ((pQVar9[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 0x40) == 0) {
        TVar3 = QTransform::type(this_00);
        if (TVar3 != TxScale) {
          path.d_ptr.d.ptr =
               (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QPainterPath::QPainterPath(&path);
          QPainterPath::addRect(&path,r);
          (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x36])
                    (this,&path,this_02);
          QPainterPath::~QPainterPath(&path);
          goto LAB_00376030;
        }
      }
      QRasterPaintEnginePrivate::initializeRasterizer(this_01,this_02);
      QRasterizer::setAntialiased
                ((this_01->rasterizer).d,
                 SUB41(((ushort)pQVar9[0x105].dirtyFlags.
                                super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                                super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 8) >> 3,0));
      QRectF::normalized();
      local_d8.x2.m_i = 0xffffffff;
      local_d8.x1.m_i = -1;
      local_d8.y1.m_i = -1;
      local_d8.y2.m_i = -1;
      local_e8.yp = (dStack_90 + -NAN + -NAN) * 0.5;
      local_e8.xp = ((double)path.d_ptr.d.ptr + (double)path.d_ptr.d.ptr) * 0.5;
      local_d8 = (QRect)QTransform::map(this_00,&local_e8);
      local_e8.yp._0_4_ = 0xffffffff;
      local_e8.xp = -NAN;
      local_e8.yp._4_4_ = 0xffffffff;
      local_f8.xp = ((double)path.d_ptr.d.ptr + local_98 + (double)path.d_ptr.d.ptr + local_98) *
                    0.5;
      local_f8.yp = (dStack_90 + -NAN + -NAN) * 0.5;
      local_e8 = QTransform::map(this_00,&local_f8);
      if ((pQVar9[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 0x40) == 0) {
        dVar13 = (*(double *)(pQVar9 + 0x3e) * dStack_90) / (*(double *)(pQVar9 + 0x36) * local_98);
        uVar11 = -(ulong)(dVar13 < -dVar13);
        qVar12 = (qreal)(~uVar11 & (ulong)dVar13 | (ulong)-dVar13 & uVar11);
      }
      else {
        qVar12 = dStack_90 / local_98;
      }
      QRasterizer::rasterizeLine
                ((this_01->rasterizer).d,(QPointF *)&local_d8,&local_e8,qVar12,false);
    }
  }
  else {
    pQVar5 = QRasterPaintEnginePrivate::clip(this_01);
    (this_01->image_filler).clip = pQVar5;
    local_88.m_matrix[0][0] = 0.0;
    local_88.m_matrix[0][1] = -NAN;
    QSpanData::initTexture
              (&this_01->image_filler,(QImage *)local_c8,
               pQVar9[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
               super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,Tiled,(QRect *)&local_88);
    if ((this_01->image_filler).blend != (ProcessSpans)0x0) {
      (this_01->image_filler).dx = sr->xp - (r->xp + *(double *)(pQVar9 + 0x42));
      (this_01->image_filler).dy = sr->yp - (r->yp + *(double *)(pQVar9 + 0x44));
      local_88.m_matrix[0][2] = r->w;
      local_88.m_matrix[1][0] = r->h;
      local_88.m_matrix[0][0] = *(double *)(pQVar9 + 0x42) + r->xp;
      local_88.m_matrix[0][1] = *(double *)(pQVar9 + 0x44) + r->yp;
      QRectF::normalized();
      local_d8 = QRectF::toRect((QRectF *)&path);
      fillRect_normalized(&local_d8,&this_01->image_filler,this_01);
    }
  }
LAB_00376030:
  QImage::~QImage((QImage *)local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::drawTiledPixmap(const QRectF &r, const QPixmap &pixmap, const QPointF &sr)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " - QRasterPaintEngine::drawTiledPixmap(), r=" << r << "pixmap=" << pixmap.size();
#endif
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();
    Q_ASSERT(s);

    QImage image;

    QPlatformPixmap *pd = pixmap.handle();
    if (pd->classId() == QPlatformPixmap::RasterClass) {
        image = static_cast<QRasterPlatformPixmap *>(pd)->image;
    } else {
        image = pixmap.toImage();
    }

    if (image.depth() == 1)
        image = d->rasterBuffer->colorizeBitmap(image, s->pen.color());

    const qreal pixmapDevicePixelRatio = pixmap.devicePixelRatio();
    if (s->matrix.type() > QTransform::TxTranslate || pixmapDevicePixelRatio > qreal(1.0)) {
        QTransform copy = s->matrix;
        copy.translate(r.x(), r.y());
        copy.translate(-sr.x(), -sr.y());
        const qreal inverseDpr = qreal(1.0) / pixmapDevicePixelRatio;
        copy.scale(inverseDpr, inverseDpr);
        d->image_filler_xform.clip = d->clip();
        d->image_filler_xform.initTexture(&image, s->intOpacity, QTextureData::Tiled);
        if (!d->image_filler_xform.blend)
            return;
        d->image_filler_xform.setupMatrix(copy, s->flags.bilinear);

#ifdef QT_FAST_SPANS
        ensureRasterState();
        if (s->flags.tx_noshear || s->matrix.type() == QTransform::TxScale) {
            d->initializeRasterizer(&d->image_filler_xform);
            d->rasterizer->setAntialiased(s->flags.antialiased);

            const QRectF &rect = r.normalized();
            const QPointF a = s->matrix.map((rect.topLeft() + rect.bottomLeft()) * 0.5f);
            const QPointF b = s->matrix.map((rect.topRight() + rect.bottomRight()) * 0.5f);
            if (s->flags.tx_noshear)
                d->rasterizer->rasterizeLine(a, b, rect.height() / rect.width());
            else
                d->rasterizer->rasterizeLine(a, b, qAbs((s->matrix.m22() * rect.height()) / (s->matrix.m11() * rect.width())));
            return;
        }
#endif
        QPainterPath path;
        path.addRect(r);
        fillPath(path, &d->image_filler_xform);
    } else {
        d->image_filler.clip = d->clip();

        d->image_filler.initTexture(&image, s->intOpacity, QTextureData::Tiled);
        if (!d->image_filler.blend)
            return;
        d->image_filler.dx = -(r.x() + s->matrix.dx()) + sr.x();
        d->image_filler.dy = -(r.y() + s->matrix.dy()) + sr.y();

        QRectF rr = r;
        rr.translate(s->matrix.dx(), s->matrix.dy());
        fillRect_normalized(rr.normalized().toRect(), &d->image_filler, d);
    }
}